

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O1

void __thiscall Signal::Signal(Signal *this,bool set)

{
  pthread_cond_init((pthread_cond_t *)this,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)this->mdata,(pthread_mutexattr_t *)0x0);
  this->signaled = set;
  return;
}

Assistant:

Signal::Signal(bool set)
{
#ifdef _WIN32
  VERIFY(handle = CreateEvent(NULL, TRUE, set ? TRUE : FALSE, NULL));
#else
  ASSERT(sizeof(cdata) >= sizeof(pthread_cond_t));
  ASSERT(sizeof(mdata) >= sizeof(pthread_mutex_t));
  pthread_cond_init((pthread_cond_t*)cdata, 0);
  pthread_mutex_init((pthread_mutex_t*)mdata, 0);
  signaled = set;
#endif
}